

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

void __thiscall
QPixmap::QPixmap(QPixmap *this,QString *fileName,char *format,ImageConversionFlags flags)

{
  bool bVar1;
  
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007e3618;
  (this->data).d.ptr = (QPlatformPixmap *)0x0;
  bVar1 = qt_pixmap_thread_test();
  if (bVar1) {
    load(this,fileName,format,flags);
    return;
  }
  return;
}

Assistant:

QPixmap::QPixmap(const QString& fileName, const char *format, Qt::ImageConversionFlags flags)
    : QPaintDevice()
{
    doInit(0, 0, QPlatformPixmap::PixmapType);
    if (!qt_pixmap_thread_test())
        return;

    load(fileName, format, flags);
}